

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator*
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,
          ChebyshevExpansion *ce2)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double dVar5;
  ChebyshevExpansion *pCVar6;
  MatrixXd *pMVar7;
  char *__function;
  ulong uVar8;
  MatrixXd *pMVar9;
  Index size_1;
  long lVar10;
  ulong uVar11;
  size_t N;
  Index size;
  VectorXd a;
  VectorXd b;
  void *local_98;
  long local_90;
  void *local_88;
  long local_80;
  ChebyshevExpansion *local_78;
  vectype local_70;
  MatrixXd *local_60;
  MatrixXd *local_58;
  undefined1 *local_50;
  MatrixXd *local_48;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_40;
  
  uVar2 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar3 = (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  pMVar9 = (MatrixXd *)(uVar2 + uVar3 + -1);
  local_50 = (undefined1 *)0x0;
  local_78 = __return_storage_ptr__;
  local_60 = pMVar9;
  if ((long)pMVar9 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_98,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_60);
  local_50 = (undefined1 *)0x0;
  local_60 = pMVar9;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_88,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_60);
  if (-1 < (long)uVar2 || local_98 == (void *)0x0) {
    if (((long)uVar2 < 0) || (local_90 < (long)uVar2)) {
LAB_0012e9b7:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                    ,0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    if (uVar2 == (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows) {
      uVar8 = uVar2;
      if ((((ulong)local_98 & 7) == 0) &&
         (uVar8 = (ulong)((uint)((ulong)local_98 >> 3) & 1), uVar2 <= uVar8)) {
        uVar8 = uVar2;
      }
      pdVar4 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lVar10 = uVar2 - uVar8;
      if (uVar8 != 0) {
        uVar11 = 0;
        do {
          *(double *)((long)local_98 + uVar11 * 8) = pdVar4[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      uVar11 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
      if (1 < lVar10) {
        do {
          dVar5 = (pdVar4 + uVar8)[1];
          pdVar1 = (double *)((long)local_98 + uVar8 * 8);
          *pdVar1 = pdVar4[uVar8];
          pdVar1[1] = dVar5;
          uVar8 = uVar8 + 2;
        } while ((long)uVar8 < (long)uVar11);
      }
      if ((long)uVar11 < (long)uVar2) {
        do {
          *(double *)((long)local_98 + uVar11 * 8) = pdVar4[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      if ((long)uVar3 < 0 && local_88 != (void *)0x0) goto LAB_0012e998;
      if (((long)uVar3 < 0) || (local_80 < (long)uVar3)) goto LAB_0012e9b7;
      if (uVar3 == (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows) {
        uVar8 = uVar3;
        if ((((ulong)local_88 & 7) == 0) &&
           (uVar8 = (ulong)((uint)((ulong)local_88 >> 3) & 1), uVar3 <= uVar8)) {
          uVar8 = uVar3;
        }
        pdVar4 = (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data;
        lVar10 = uVar3 - uVar8;
        if (uVar8 != 0) {
          uVar11 = 0;
          do {
            *(double *)((long)local_88 + uVar11 * 8) = pdVar4[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar8 != uVar11);
        }
        uVar11 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
        if (1 < lVar10) {
          do {
            dVar5 = (pdVar4 + uVar8)[1];
            pdVar1 = (double *)((long)local_88 + uVar8 * 8);
            *pdVar1 = pdVar4[uVar8];
            pdVar1[1] = dVar5;
            uVar8 = uVar8 + 2;
          } while ((long)uVar8 < (long)uVar11);
        }
        N = (uVar2 + uVar3) - 2;
        if ((long)uVar11 < (long)uVar3) {
          do {
            *(double *)((long)local_88 + uVar11 * 8) = pdVar4[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar3 != uVar11);
        }
        pMVar9 = UMatrixLibrary::get((UMatrixLibrary *)u_matrix_library,N);
        pMVar7 = LMatrixLibrary::get((LMatrixLibrary *)l_matrix_library,N);
        lVar10 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_cols;
        if ((lVar10 == local_90) && (lVar10 == local_80)) {
          local_60 = pMVar7;
          local_58 = pMVar9;
          local_48 = pMVar9;
          local_40 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_88;
          if ((pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols == (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows) {
            local_50 = (undefined1 *)&local_98;
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const>const>,0>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_70,
                       (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>_>,_0>_>
                        *)&local_60);
            pCVar6 = local_78;
            ChebyshevExpansion(local_78,&local_70,this->m_xmin,this->m_xmax);
            free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
            free(local_88);
            free(local_98);
            return pCVar6;
          }
          __function = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>>>, Option = 0]"
          ;
          local_50 = (undefined1 *)&local_98;
        }
        else {
          __function = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
          ;
        }
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Product.h"
                      ,0x62,__function);
      }
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseBase.h"
                  ,0x106,
                  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                 );
  }
LAB_0012e998:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,
                "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
               );
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::operator*(const ChebyshevExpansion &ce2) const {

        std::size_t order1 = this->m_c.size()-1,
                    order2 = ce2.coef().size()-1;
        // The order of the product is the sum of the orders of the two expansions
        std::size_t Norder_product = order1 + order2;

        // Create padded vectors, and copy into them the coefficients from this instance
        // and that of the donor
        Eigen::VectorXd a = Eigen::VectorXd::Zero(Norder_product+1),
                        b = Eigen::VectorXd::Zero(Norder_product+1);
        a.head(order1+1) = this->m_c; b.head(order2+1) = ce2.coef();

        // Get the matrices U and V from the libraries
        const Eigen::MatrixXd &U = u_matrix_library.get(Norder_product);
        const Eigen::MatrixXd &V = l_matrix_library.get(Norder_product);

        // Carry out the calculation of the final coefficients
        // U*a is the functional values at the Chebyshev-Lobatto nodes for the first expansion
        // U*b is the functional values at the Chebyshev-Lobatto nodes for the second expansion
        // The functional values are multiplied together in an element-wise sense - this is why both products are turned into arrays
        // The pre-multiplication by V takes us back to coefficients
        return ChebyshevExpansion(V*((U*a).array() * (U*b).array()).matrix(), m_xmin, m_xmax);
    }